

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autocorrelation_to_composite_sinusoidal_modeling.h
# Opt level: O0

void __thiscall sptk::AutocorrelationToCompositeSinusoidalModeling::Buffer::Buffer(Buffer *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__Buffer_0012dba8;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x104e1b);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x104e2e);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x104e41);
  SymmetricMatrix::SymmetricMatrix((SymmetricMatrix *)(in_RDI + 10),(int)((ulong)in_RDI >> 0x20));
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x104e6d);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)0x104e83);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x104e99);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x104eaf);
  SymmetricSystemSolver::Buffer::Buffer((Buffer *)0x104ec5);
  VandermondeSystemSolver::Buffer::Buffer((Buffer *)0x104ed8);
  return;
}

Assistant:

Buffer() {
    }